

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

int Gia_ManBmcPerform(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  long lVar4;
  
  iVar1 = pPars->nTimeOut;
  if ((long)iVar1 == 0) {
    lVar4 = 0;
  }
  else {
    aVar3 = Abc_Clock();
    lVar4 = aVar3 + (long)iVar1 * 1000000;
  }
  if (pPars->nFramesAdd == 0) {
    iVar1 = Gia_ManBmcPerformInt(pGia,pPars);
    return iVar1;
  }
  if (pPars->nTimeOut < 0) {
    __assert_fail("pPars->nTimeOut >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                  ,0x430,"int Gia_ManBmcPerform(Gia_Man_t *, Bmc_AndPar_t *)");
  }
  while( true ) {
    if ((lVar4 != 0) && (aVar3 = Abc_Clock(), lVar4 < aVar3)) {
      return -1;
    }
    iVar1 = Gia_ManBmcPerformInt(pGia,pPars);
    if (iVar1 == 0) {
      return 0;
    }
    if (pPars->nTimeOut == 0) break;
    iVar1 = pPars->nTimeOut + -1;
    aVar3 = Abc_Clock();
    iVar2 = (int)((lVar4 - aVar3) / 1000000);
    if (iVar2 <= iVar1) {
      iVar1 = iVar2;
    }
    pPars->nTimeOut = iVar1;
    if (iVar1 < 1) {
      return -1;
    }
    pPars->nFramesAdd = pPars->nFramesAdd << 1;
  }
  return -1;
}

Assistant:

int Gia_ManBmcPerform( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    abctime TimeToStop = pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    if ( pPars->nFramesAdd == 0 )
        return Gia_ManBmcPerformInt( pGia, pPars );
    // iterate over the engine until we read the global timeout
    assert( pPars->nTimeOut >= 0 );
    while ( 1 )
    {
        if ( TimeToStop && TimeToStop < Abc_Clock() )
            return -1;
        if ( Gia_ManBmcPerformInt( pGia, pPars ) == 0 )
            return 0;
        // set the new runtime limit
        if ( pPars->nTimeOut )
        {
            pPars->nTimeOut = Abc_MinInt( pPars->nTimeOut-1, (int)((TimeToStop - Abc_Clock()) / CLOCKS_PER_SEC) );
            if ( pPars->nTimeOut <= 0 )
                return -1;
        }
        else
            return -1;
        // set the new frames limit
        pPars->nFramesAdd *= 2;
    }
    return -1;
}